

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchStateController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchStateController **ppStateController)

{
  PAL_ERROR PVar1;
  CSynchStateController *pCVar2;
  
  if (odObjectDomain == SharedObject) {
    pvSynchData = SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  pCVar2 = CSynchCache<CorUnix::CSynchStateController>::Get(&this->m_cacheStateCtrlrs,pthrCurrent);
  if (pCVar2 == (CSynchStateController *)0x0) {
    PVar1 = 8;
  }
  else {
    CSynchControllerBase::Init
              (&pCVar2->super_CSynchControllerBase,pthrCurrent,StateController,odObjectDomain,
               potObjectType,(CSynchData *)pvSynchData,(uint)(odObjectDomain == SharedObject) * 2);
    *ppStateController = &pCVar2->super_ISynchStateController;
    PVar1 = 0;
  }
  return PVar1;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchStateController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchStateController **ppStateController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchStateController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheStateCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSSC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::StateController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppStateController = (ISynchStateController *)pCtrlr;

    CSSC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheStateCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }